

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O1

void checkSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *soplex)

{
  double dVar1;
  undefined4 uVar2;
  Verbosity VVar3;
  ostream **ppoVar4;
  undefined8 uVar5;
  undefined8 *puVar6;
  bool bVar7;
  int iVar8;
  size_t sVar9;
  int *piVar10;
  long lVar11;
  Verbosity old_verbosity;
  Verbosity VVar12;
  char *pcVar13;
  ostream *poVar14;
  data_type *pdVar15;
  longdouble lVar16;
  Rational rowviol;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxviol_2;
  Rational sumviol;
  Rational maxviol;
  Rational boundviol;
  true_ local_1b9;
  data_type local_1b8;
  undefined8 local_1a8;
  undefined5 uStack_1a0;
  undefined3 uStack_19b;
  uint local_198;
  undefined4 uStack_194;
  undefined1 local_190 [5];
  undefined3 uStack_18b;
  undefined8 local_188;
  data_type local_178;
  undefined8 local_168;
  limb_pointer puStack_160;
  ulong local_158;
  undefined4 local_150;
  undefined4 uStack_14c;
  int local_148;
  undefined1 uStack_144;
  char cStack_143;
  char cStack_142;
  undefined1 uStack_141;
  data_type local_138;
  undefined8 local_128;
  undefined5 uStack_120;
  undefined3 uStack_11b;
  uint local_118;
  undefined4 uStack_114;
  undefined5 local_110;
  undefined3 uStack_10b;
  undefined8 local_108;
  data_type local_f8;
  undefined8 local_e8;
  undefined5 uStack_e0;
  undefined3 uStack_db;
  uint local_d8;
  undefined1 uStack_d4;
  undefined3 uStack_d3;
  undefined5 local_d0;
  undefined3 uStack_cb;
  undefined8 local_c8;
  data_type local_b8;
  undefined8 local_a8;
  undefined5 uStack_a0;
  undefined3 uStack_9b;
  uint local_98;
  undefined4 uStack_94;
  undefined4 local_90;
  uint uStack_8c;
  undefined8 local_88;
  double local_78;
  double local_70;
  data_type local_68;
  undefined8 local_58;
  limb_pointer puStack_50;
  ulong local_48;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  
  iVar8 = soplex->_currentSettings->_intParamValues[0x12];
  if ((iVar8 == 2) || ((iVar8 == 1 && (soplex->_currentSettings->_intParamValues[0x10] == 1)))) {
    if ((soplex->_hasSolReal == false) && ((soplex->_hasSolRational & 1U) == 0)) {
      VVar12 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar12) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"No primal solution available.\n",0x1e);
        (soplex->spxout).m_verbosity = VVar12;
      }
    }
    else {
      local_b8.la[0] = 0;
      local_a8 = CONCAT17(local_a8._7_1_,0x10000000001);
      local_98 = 1;
      uStack_94 = 0;
      local_88 = CONCAT17(local_88._7_1_,0x10000000001);
      local_1b8.la[0] = 0;
      local_1a8 = CONCAT17(local_1a8._7_1_,0x10000000001);
      local_198 = 1;
      uStack_194 = 0;
      local_188 = CONCAT17(local_188._7_1_,0x10000000001);
      local_138.la[0] = 0;
      local_128 = CONCAT17(local_128._7_1_,0x10000000001);
      local_118 = 1;
      uStack_114 = 0;
      local_108 = CONCAT17(local_108._7_1_,0x10000000001);
      bVar7 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::getBoundViolationRational(soplex,(Rational *)&local_b8.ld,(Rational *)&local_138.ld)
      ;
      if (bVar7) {
        bVar7 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getRowViolationRational
                          (soplex,(Rational *)&local_1b8.ld,(Rational *)&local_138.ld);
        if (!bVar7) goto LAB_0033de5e;
        VVar12 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar12) {
          (soplex->spxout).m_verbosity = INFO1;
          iVar8 = boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_b8.ld,
                            (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_1b8.ld);
          pdVar15 = &local_1b8;
          if (0 < iVar8) {
            pdVar15 = &local_b8;
          }
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_f8.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&pdVar15->ld);
          dVar1 = soplex->_currentSettings->_realParamValues[0];
          if (NAN(dVar1)) {
            pcVar13 = "infeasible";
          }
          else {
            lVar16 = (longdouble)dVar1;
            local_178.ld.capacity = SUB104(lVar16,0);
            local_178.la[0]._4_4_ = (undefined4)((unkuint10)lVar16 >> 0x20);
            local_178.la[1]._0_2_ = (undefined2)((unkuint10)lVar16 >> 0x40);
            local_70 = dVar1;
            bVar7 = boost::multiprecision::default_ops::
                    eval_gt_imp<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,long_double>
                              ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)&local_f8.ld,(longdouble *)&local_178,(true_ *)&local_68.ld);
            pcVar13 = "feasible";
            if (bVar7) {
              pcVar13 = "infeasible";
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"Primal solution ",
                     0x10);
          poVar14 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          sVar9 = strlen(pcVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,pcVar13,sVar9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                     " in original problem (max. violation = ",0x27);
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_178.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_f8.ld);
          boost::multiprecision::operator<<
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                     (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)&local_178.ld);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],").\n",3);
          if ((cStack_143 == '\0') && (cStack_142 == '\0')) {
            operator_delete((void *)CONCAT44(uStack_14c,local_150),(local_158 & 0xffffffff) << 3);
          }
          if ((local_168._5_1_ == '\0') && (local_168._6_1_ == '\0')) {
            operator_delete((void *)CONCAT62(local_178.la[1]._2_6_,local_178.la[1]._0_2_),
                            (ulong)local_178.ld.capacity << 3);
          }
          (soplex->spxout).m_verbosity = VVar12;
          if ((local_c8._5_1_ == '\0') && (local_c8._6_1_ == '\0')) {
            operator_delete((void *)CONCAT35(uStack_cb,local_d0),(ulong)local_d8 << 3);
          }
          if ((local_e8._5_1_ == '\0') && (local_e8._6_1_ == '\0')) {
            operator_delete(local_f8.ld.data,(local_f8.la[0] & 0xffffffff) << 3);
          }
        }
      }
      else {
LAB_0033de5e:
        VVar12 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar12) {
          (soplex->spxout).m_verbosity = INFO1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[3],"Could not check primal solution.\n",0x21);
          (soplex->spxout).m_verbosity = VVar12;
        }
      }
      if ((local_108._5_1_ == '\0') && (local_108._6_1_ == '\0')) {
        operator_delete((void *)CONCAT35(uStack_10b,local_110),(ulong)local_118 << 3);
      }
      if ((local_128._5_1_ == '\0') && (local_128._6_1_ == '\0')) {
        operator_delete(local_138.ld.data,(local_138.la[0] & 0xffffffff) << 3);
      }
      if ((local_188._5_1_ == '\0') && (local_188._6_1_ == '\0')) {
        operator_delete((void *)CONCAT35(uStack_18b,local_190),(ulong)local_198 << 3);
      }
      if ((local_1a8._5_1_ == '\0') && (local_1a8._6_1_ == '\0')) {
        operator_delete(local_1b8.ld.data,(local_1b8.la[0] & 0xffffffff) << 3);
      }
      if ((local_88._5_1_ == '\0') && (local_88._6_1_ == '\0')) {
        operator_delete((void *)CONCAT44(uStack_8c,local_90),(ulong)local_98 << 3);
      }
      if ((local_a8._5_1_ == '\0') && (local_a8._6_1_ == '\0')) {
        operator_delete(local_b8.ld.data,(local_b8.la[0] & 0xffffffff) << 3);
      }
    }
    if ((soplex->_hasSolReal != false) || ((soplex->_hasSolRational & 1U) != 0)) {
      local_b8.la[0] = 0;
      local_a8 = CONCAT17(local_a8._7_1_,0x10000000001);
      local_98 = 1;
      uStack_94 = 0;
      local_88 = CONCAT17(local_88._7_1_,0x10000000001);
      local_1b8.la[0] = 0;
      local_1a8 = CONCAT17(local_1a8._7_1_,0x10000000001);
      local_198 = 1;
      uStack_194 = 0;
      local_188 = CONCAT17(local_188._7_1_,0x10000000001);
      local_138.la[0] = 0;
      local_128 = CONCAT17(local_128._7_1_,0x10000000001);
      local_118 = 1;
      uStack_114 = 0;
      local_108 = CONCAT17(local_108._7_1_,0x10000000001);
      bVar7 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::getRedCostViolationRational
                        (soplex,(Rational *)&local_b8.ld,(Rational *)&local_138.ld);
      if (bVar7) {
        bVar7 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getDualViolationRational
                          (soplex,(Rational *)&local_1b8.ld,(Rational *)&local_138.ld);
        if (!bVar7) goto LAB_0033e25a;
        VVar12 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar12) {
          (soplex->spxout).m_verbosity = INFO1;
          iVar8 = boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_b8.ld,
                            (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_1b8.ld);
          pdVar15 = &local_1b8;
          if (0 < iVar8) {
            pdVar15 = &local_b8;
          }
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_f8.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&pdVar15->ld);
          dVar1 = soplex->_currentSettings->_realParamValues[1];
          if (NAN(dVar1)) {
            pcVar13 = "infeasible";
          }
          else {
            lVar16 = (longdouble)dVar1;
            local_68.ld.capacity = SUB104(lVar16,0);
            local_68.la[0]._4_4_ = (undefined4)((unkuint10)lVar16 >> 0x20);
            local_68.la[1]._0_2_ = (undefined2)((unkuint10)lVar16 >> 0x40);
            local_78 = dVar1;
            bVar7 = boost::multiprecision::default_ops::
                    eval_gt_imp<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,long_double>
                              ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)&local_f8.ld,(longdouble *)&local_68,&local_1b9);
            pcVar13 = "feasible";
            if (bVar7) {
              pcVar13 = "infeasible";
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"Dual solution ",0xe);
          poVar14 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          sVar9 = strlen(pcVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,pcVar13,sVar9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                     " in original problem (max. violation = ",0x27);
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_68.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_f8.ld);
          boost::multiprecision::operator<<
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                     (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)&local_68.ld);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],").\n",3);
          if ((local_38._5_1_ == '\0') && (local_38._6_1_ == '\0')) {
            operator_delete((void *)CONCAT44(uStack_3c,local_40),(local_48 & 0xffffffff) << 3);
          }
          if ((local_58._5_1_ == '\0') && (local_58._6_1_ == '\0')) {
            operator_delete((void *)CONCAT62(local_68.la[1]._2_6_,local_68.la[1]._0_2_),
                            (ulong)local_68.ld.capacity << 3);
          }
          (soplex->spxout).m_verbosity = VVar12;
          if ((local_c8._5_1_ == '\0') && (local_c8._6_1_ == '\0')) {
            operator_delete((void *)CONCAT35(uStack_cb,local_d0),(ulong)local_d8 << 3);
          }
          if ((local_e8._5_1_ == '\0') && (local_e8._6_1_ == '\0')) {
            operator_delete(local_f8.ld.data,(local_f8.la[0] & 0xffffffff) << 3);
          }
        }
      }
      else {
LAB_0033e25a:
        VVar12 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar12) {
          (soplex->spxout).m_verbosity = INFO1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[3],"Could not check dual solution.\n",0x1f);
          (soplex->spxout).m_verbosity = VVar12;
        }
      }
      if ((local_108._5_1_ == '\0') && (local_108._6_1_ == '\0')) {
        operator_delete((void *)CONCAT35(uStack_10b,local_110),(ulong)local_118 << 3);
      }
      if ((local_128._5_1_ == '\0') && (local_128._6_1_ == '\0')) {
        operator_delete(local_138.ld.data,(local_138.la[0] & 0xffffffff) << 3);
      }
      if ((local_188._5_1_ == '\0') && (local_188._6_1_ == '\0')) {
        operator_delete((void *)CONCAT35(uStack_18b,local_190),(ulong)local_198 << 3);
      }
      if ((local_1a8._5_1_ == '\0') && (local_1a8._6_1_ == '\0')) {
        operator_delete(local_1b8.ld.data,(local_1b8.la[0] & 0xffffffff) << 3);
      }
      if ((local_88._5_1_ == '\0') && (local_88._6_1_ == '\0')) {
        operator_delete((void *)CONCAT44(uStack_8c,local_90),(ulong)local_98 << 3);
      }
      if ((local_a8._5_1_ == '\0') && (local_a8._6_1_ == '\0')) {
        operator_delete(local_b8.ld.data,(local_b8.la[0] & 0xffffffff) << 3);
      }
      goto LAB_0033e375;
    }
LAB_0033df8b:
    VVar12 = (soplex->spxout).m_verbosity;
    if ((int)VVar12 < 3) goto LAB_0033e375;
    (soplex->spxout).m_verbosity = INFO1;
    poVar14 = (soplex->spxout).m_streams[3];
    pcVar13 = "No dual solution available.\n";
    lVar11 = 0x1c;
  }
  else {
    if ((soplex->_hasSolReal == false) && ((soplex->_hasSolRational & 1U) == 0)) {
      VVar12 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar12) {
        (soplex->spxout).m_verbosity = INFO1;
        poVar14 = (soplex->spxout).m_streams[3];
        pcVar13 = "No primal solution available.\n";
        lVar11 = 0x1e;
LAB_0033db73:
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,pcVar13,lVar11);
        (soplex->spxout).m_verbosity = VVar12;
      }
    }
    else {
      local_188 = 0xa00000000;
      local_1b8.la[0] = 0;
      local_1b8.ld.data = (limb_pointer)0x0;
      local_1a8 = 0;
      uStack_1a0 = 0;
      uStack_19b = 0;
      local_198 = 0;
      uStack_194 = 0;
      local_190 = (undefined1  [5])0x0;
      local_108 = 0xa00000000;
      local_138.la[0] = 0;
      local_138.ld.data = (limb_pointer)0x0;
      local_128 = 0;
      uStack_120 = 0;
      uStack_11b = 0;
      local_118 = 0;
      uStack_114 = 0;
      local_110 = 0;
      local_c8 = 0xa00000000;
      local_f8.la[0] = 0;
      local_f8.ld.data = (limb_pointer)0x0;
      local_e8 = 0;
      uStack_e0 = 0;
      uStack_db = 0;
      local_d8 = 0;
      uStack_d4 = 0;
      uStack_d3 = 0;
      local_d0 = 0;
      bVar7 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::getBoundViolation(soplex,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_1b8.ld,
                                  (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_f8.ld);
      if (bVar7) {
        bVar7 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getRowViolation(soplex,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_138.ld,
                                  (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_f8.ld);
        if (bVar7) {
          VVar12 = (soplex->spxout).m_verbosity;
          if (2 < (int)VVar12) {
            (soplex->spxout).m_verbosity = INFO1;
            bVar7 = false;
            if (((int)local_188 != 2) && (bVar7 = false, (int)local_108 != 2)) {
              iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                ((cpp_dec_float<50U,_int,_void> *)&local_1b8.ld,
                                 (cpp_dec_float<50U,_int,_void> *)&local_138.ld);
              bVar7 = 0 < iVar8;
            }
            pdVar15 = &local_138;
            if (bVar7) {
              pdVar15 = &local_1b8;
            }
            local_158 = *(ulong *)&(&pdVar15->ld)[2].capacity;
            uVar5 = *(undefined8 *)
                     (((cpp_dec_float<50U,_int,_void> *)&(pdVar15->ld).capacity)->data)._M_elems;
            local_168 = *(undefined8 *)&(&pdVar15->ld)[1].capacity;
            puStack_160 = (&pdVar15->ld)[1].data;
            local_178.ld.capacity = (uint)uVar5;
            local_178.la[0]._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
            local_178.la[1]._0_2_ = SUB82((pdVar15->ld).data,0);
            local_178.la[1]._2_6_ = (undefined6)((ulong)(pdVar15->ld).data >> 0x10);
            local_150 = *(undefined4 *)&(&pdVar15->ld)[2].data;
            uStack_14c = CONCAT31(uStack_14c._1_3_,
                                  *(undefined1 *)((long)&(&pdVar15->ld)[2].data + 4));
            piVar10 = (int *)&local_108;
            if (bVar7) {
              piVar10 = (int *)&local_188;
            }
            local_148 = *piVar10;
            puVar6 = &local_108;
            if (bVar7) {
              puVar6 = &local_188;
            }
            uVar2 = *(undefined4 *)((long)puVar6 + 4);
            uStack_144 = (undefined1)uVar2;
            cStack_143 = (char)((uint)uVar2 >> 8);
            cStack_142 = (char)((uint)uVar2 >> 0x10);
            uStack_141 = (undefined1)((uint)uVar2 >> 0x18);
            pcVar13 = "infeasible";
            if ((*piVar10 != 2) &&
               (dVar1 = soplex->_currentSettings->_realParamValues[0], !NAN(dVar1))) {
              local_88 = 0xa00000000;
              local_b8.la[0] = 0;
              local_b8.ld.data = (limb_pointer)0x0;
              local_a8 = 0;
              uStack_a0 = 0;
              uStack_9b = 0;
              local_98 = 0;
              uStack_94 = 0;
              local_90 = 0;
              uStack_8c = uStack_8c & 0xffffff00;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&local_b8.ld,dVar1);
              iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                ((cpp_dec_float<50U,_int,_void> *)&local_178.ld,
                                 (cpp_dec_float<50U,_int,_void> *)&local_b8.ld);
              pcVar13 = "infeasible";
              if (iVar8 < 1) {
                pcVar13 = "feasible";
              }
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"Primal solution ",
                       0x10);
            poVar14 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
            sVar9 = strlen(pcVar13);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,pcVar13,sVar9);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                       " in original problem (max. violation = ",0x27);
            VVar3 = (soplex->spxout).m_verbosity;
            ppoVar4 = (soplex->spxout).m_streams;
            poVar14 = ppoVar4[VVar3];
            *(uint *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 0x18) =
                 *(uint *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 0x18) & 0xfffffefb |
                 0x100;
            local_48 = local_158;
            local_58 = local_168;
            puStack_50 = puStack_160;
            local_68.ld.capacity = local_178.ld.capacity;
            local_68.la[0]._4_4_ = local_178.la[0]._4_4_;
            local_68.la[1]._0_2_ = local_178.la[1]._0_2_;
            local_68.la[1]._2_6_ = local_178.la[1]._2_6_;
            local_40 = local_150;
            uStack_3c = CONCAT31(uStack_3c._1_3_,(undefined1)uStack_14c);
            local_38 = CONCAT17(uStack_141,
                                CONCAT16(cStack_142,
                                         CONCAT15(cStack_143,CONCAT14(uStack_144,local_148))));
            boost::multiprecision::operator<<
                      (ppoVar4[VVar3],
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_68.ld);
            poVar14 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
            lVar11 = *(long *)poVar14;
            *(undefined8 *)(poVar14 + *(long *)(lVar11 + -0x18) + 8) = 8;
            lVar11 = *(long *)(lVar11 + -0x18);
            *(uint *)(poVar14 + lVar11 + 0x18) = *(uint *)(poVar14 + lVar11 + 0x18) & 0xfffffefb | 4
            ;
            pcVar13 = ").\n";
            lVar11 = 3;
            goto LAB_0033db73;
          }
          goto LAB_0033db7b;
        }
      }
      VVar12 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar12) {
        (soplex->spxout).m_verbosity = INFO1;
        poVar14 = (soplex->spxout).m_streams[3];
        pcVar13 = "Could not check primal solution.\n";
        lVar11 = 0x21;
        goto LAB_0033db73;
      }
    }
LAB_0033db7b:
    if ((soplex->_hasSolReal == false) && ((soplex->_hasSolRational & 1U) == 0)) goto LAB_0033df8b;
    local_188 = 0xa00000000;
    local_1b8.la[0] = 0;
    local_1b8.ld.data = (limb_pointer)0x0;
    local_1a8 = 0;
    uStack_1a0 = 0;
    uStack_19b = 0;
    local_198 = 0;
    uStack_194 = 0;
    local_190 = (undefined1  [5])0x0;
    local_108 = 0xa00000000;
    local_138.la[0] = 0;
    local_138.ld.data = (limb_pointer)0x0;
    local_128 = 0;
    uStack_120 = 0;
    uStack_11b = 0;
    local_118 = 0;
    uStack_114 = 0;
    local_110 = 0;
    local_c8 = 0xa00000000;
    local_f8.la[0] = 0;
    local_f8.ld.data = (limb_pointer)0x0;
    local_e8 = 0;
    uStack_e0 = 0;
    uStack_db = 0;
    local_d8 = 0;
    uStack_d4 = 0;
    uStack_d3 = 0;
    local_d0 = 0;
    bVar7 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::getRedCostViolation
                      (soplex,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_1b8.ld,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_f8.ld);
    if (bVar7) {
      bVar7 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::getDualViolation(soplex,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)&local_138.ld,
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_f8.ld);
      if (!bVar7) goto LAB_0033de32;
      VVar12 = (soplex->spxout).m_verbosity;
      if ((int)VVar12 < 3) goto LAB_0033e375;
      (soplex->spxout).m_verbosity = INFO1;
      bVar7 = false;
      if (((int)local_188 != 2) && (bVar7 = false, (int)local_108 != 2)) {
        iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          ((cpp_dec_float<50U,_int,_void> *)&local_1b8.ld,
                           (cpp_dec_float<50U,_int,_void> *)&local_138.ld);
        bVar7 = 0 < iVar8;
      }
      pdVar15 = &local_138;
      if (bVar7) {
        pdVar15 = &local_1b8;
      }
      local_158 = *(ulong *)&(&pdVar15->ld)[2].capacity;
      uVar5 = *(undefined8 *)
               (((cpp_dec_float<50U,_int,_void> *)&(pdVar15->ld).capacity)->data)._M_elems;
      local_168 = *(undefined8 *)&(&pdVar15->ld)[1].capacity;
      puStack_160 = (&pdVar15->ld)[1].data;
      local_178.ld.capacity = (uint)uVar5;
      local_178.la[0]._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
      local_178.la[1]._0_2_ = SUB82((pdVar15->ld).data,0);
      local_178.la[1]._2_6_ = (undefined6)((ulong)(pdVar15->ld).data >> 0x10);
      local_150 = *(undefined4 *)&(&pdVar15->ld)[2].data;
      uStack_14c = CONCAT31(uStack_14c._1_3_,*(undefined1 *)((long)&(&pdVar15->ld)[2].data + 4));
      piVar10 = (int *)&local_108;
      if (bVar7) {
        piVar10 = (int *)&local_188;
      }
      local_148 = *piVar10;
      puVar6 = &local_108;
      if (bVar7) {
        puVar6 = &local_188;
      }
      uVar2 = *(undefined4 *)((long)puVar6 + 4);
      uStack_144 = (undefined1)uVar2;
      cStack_143 = (char)((uint)uVar2 >> 8);
      cStack_142 = (char)((uint)uVar2 >> 0x10);
      uStack_141 = (undefined1)((uint)uVar2 >> 0x18);
      pcVar13 = "infeasible";
      if ((*piVar10 != 2) && (dVar1 = soplex->_currentSettings->_realParamValues[1], !NAN(dVar1))) {
        local_88 = 0xa00000000;
        local_b8.la[0] = 0;
        local_b8.ld.data = (limb_pointer)0x0;
        local_a8 = 0;
        uStack_a0 = 0;
        uStack_9b = 0;
        local_98 = 0;
        uStack_94 = 0;
        local_90 = 0;
        uStack_8c = uStack_8c & 0xffffff00;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_b8.ld,dVar1);
        iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          ((cpp_dec_float<50U,_int,_void> *)&local_178.ld,
                           (cpp_dec_float<50U,_int,_void> *)&local_b8.ld);
        pcVar13 = "infeasible";
        if (iVar8 < 1) {
          pcVar13 = "feasible";
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"Dual solution ",0xe);
      poVar14 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
      sVar9 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,pcVar13,sVar9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                 " in original problem (max. violation = ",0x27);
      VVar3 = (soplex->spxout).m_verbosity;
      ppoVar4 = (soplex->spxout).m_streams;
      poVar14 = ppoVar4[VVar3];
      *(uint *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 0x18) =
           *(uint *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 0x18) & 0xfffffefb | 0x100;
      local_98 = (uint)local_158;
      uStack_94 = (undefined4)(local_158 >> 0x20);
      local_b8.la[0] = CONCAT44(local_178.la[0]._4_4_,local_178.ld.capacity);
      local_b8.la[1] = CONCAT62(local_178.la[1]._2_6_,local_178.la[1]._0_2_);
      local_a8 = local_168;
      uStack_a0 = SUB85(puStack_160,0);
      uStack_9b = (undefined3)((ulong)puStack_160 >> 0x28);
      local_90 = local_150;
      uStack_8c = CONCAT31(uStack_8c._1_3_,(undefined1)uStack_14c);
      local_88 = CONCAT17(uStack_141,
                          CONCAT16(cStack_142,CONCAT15(cStack_143,CONCAT14(uStack_144,local_148))));
      boost::multiprecision::operator<<
                (ppoVar4[VVar3],
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_b8.ld);
      poVar14 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
      lVar11 = *(long *)poVar14;
      *(undefined8 *)(poVar14 + *(long *)(lVar11 + -0x18) + 8) = 8;
      lVar11 = *(long *)(lVar11 + -0x18);
      *(uint *)(poVar14 + lVar11 + 0x18) = *(uint *)(poVar14 + lVar11 + 0x18) & 0xfffffefb | 4;
      pcVar13 = ").\n";
      lVar11 = 3;
    }
    else {
LAB_0033de32:
      VVar12 = (soplex->spxout).m_verbosity;
      if ((int)VVar12 < 3) goto LAB_0033e375;
      (soplex->spxout).m_verbosity = INFO1;
      poVar14 = (soplex->spxout).m_streams[3];
      pcVar13 = "Could not check dual solution.\n";
      lVar11 = 0x1f;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,pcVar13,lVar11);
  (soplex->spxout).m_verbosity = VVar12;
LAB_0033e375:
  VVar12 = (soplex->spxout).m_verbosity;
  if (2 < (int)VVar12) {
    (soplex->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>((soplex->spxout).m_streams[3],"\n",1);
    (soplex->spxout).m_verbosity = VVar12;
  }
  return;
}

Assistant:

void checkSolution(SoPlexBase<R>& soplex)
{
   if(soplex.intParam(SoPlexBase<R>::CHECKMODE) == SoPlexBase<R>::CHECKMODE_RATIONAL
         || (soplex.intParam(SoPlexBase<R>::CHECKMODE) == SoPlexBase<R>::CHECKMODE_AUTO
             && soplex.intParam(SoPlexBase<R>::READMODE) == SoPlexBase<R>::READMODE_RATIONAL))
   {
      checkSolutionRational(soplex);
   }
   else
   {
      checkSolutionReal(soplex);
   }

   SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\n");
}